

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O3

void __thiscall
charls::
jls_codec<charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>,_charls::decoder_strategy>
::set_presets(jls_codec<charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>,_charls::decoder_strategy>
              *this,jpegls_pc_parameters *presets,uint32_t restart_interval)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  
  iVar1 = presets->threshold3;
  iVar2 = presets->reset_value;
  iVar3 = presets->threshold2;
  this->t1_ = presets->threshold1;
  this->t2_ = iVar3;
  this->t3_ = iVar1;
  this->reset_threshold_ = (uint8_t)iVar2;
  initialize_quantization_lut(this);
  reset_parameters(this);
  this->restart_interval_ = restart_interval;
  return;
}

Assistant:

void set_presets(const jpegls_pc_parameters& presets, const uint32_t restart_interval) override
    {
        initialize_parameters(presets.threshold1, presets.threshold2, presets.threshold3, presets.reset_value);
        restart_interval_ = restart_interval;
    }